

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O1

void shuff_build_canonical_arrays(uint64_t *cw_lens,uint64_t max_cw_length)

{
  uint64_t *puVar1;
  uint64_t *puVar2;
  uint64_t *puVar3;
  uint64_t uVar4;
  ulong *puVar5;
  uint64_t *puVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  
  shuff_offset[0] = 0;
  puVar1 = cw_lens + 1;
  puVar3 = cw_lens + max_cw_length;
  if (1 < (long)max_cw_length) {
    puVar2 = shuff_offset;
    uVar4 = 0;
    puVar6 = puVar1;
    do {
      puVar2 = puVar2 + 1;
      uVar4 = uVar4 + *puVar6;
      *puVar2 = uVar4;
      puVar6 = puVar6 + 1;
    } while (puVar6 < puVar3);
  }
  puVar5 = (ulong *)(&std::__ioinit + max_cw_length * 8);
  *(undefined8 *)(&DAT_0010b1b8 + max_cw_length * 8) = 0;
  if ((ulong *)0x10b1bf < puVar5) {
    uVar7 = *(ulong *)(&DAT_0010b1b8 + max_cw_length * 8);
    do {
      uVar7 = uVar7 + *puVar3 >> 1;
      *puVar5 = uVar7;
      puVar5 = puVar5 + -1;
      puVar3 = puVar3 + -1;
    } while ((ulong *)0x10b1bf < puVar5);
  }
  if (0 < (long)max_cw_length) {
    uVar7 = 0x3f;
    lVar8 = 0;
    do {
      if (*(long *)((long)puVar1 + lVar8) == 0) {
        lVar9 = *(long *)((long)&DAT_0010b3b8 + lVar8);
      }
      else {
        lVar9 = *(long *)((long)shuff_min_code + lVar8) << (uVar7 & 0x3f);
      }
      puVar3 = (uint64_t *)(lVar8 + 0x10b3c8);
      *(long *)((long)shuff_lj_base + lVar8) = lVar9;
      uVar7 = uVar7 - 1;
      lVar8 = lVar8 + 8;
    } while (puVar3 < shuff_lj_base + max_cw_length);
  }
  if (*puVar1 == 0) {
    lVar8 = 0;
    do {
      *(undefined8 *)((long)shuff_lj_base + lVar8) = 0xffffffffffffffff;
      lVar9 = lVar8 + 0x10;
      lVar8 = lVar8 + 8;
    } while (*(long *)((long)cw_lens + lVar9) == 0);
  }
  return;
}

Assistant:

void shuff_build_canonical_arrays(uint64_t* cw_lens, uint64_t max_cw_length)
{
    uint64_t* q;
    uint64_t* p;

    // build offset
    q = shuff_offset;
    *q = 0;
    for (p = cw_lens + 1; p < cw_lens + max_cw_length; p++, q++)
        *(q + 1) = *q + *p;

    // generate the min_code array
    // min_code[i] = (min_code[i+1] + cw_lens[i+2]) >>1
    q = shuff_min_code + max_cw_length - 1;
    *q = 0;
    for (q--, p = cw_lens + max_cw_length; q >= shuff_min_code; q--, p--)
        *q = (*(q + 1) + *p) >> 1;

    // generate the lj_base array
    q = shuff_lj_base;
    uint64_t* pp = shuff_min_code;
    int64_t left_shift = (sizeof(uint64_t) << 3) - 1;
    for (p = cw_lens + 1; q < shuff_lj_base + max_cw_length;
         p++, q++, pp++, left_shift--)
        if (*p == 0)
            *q = *(q - 1);
        else
            *q = (*pp) << left_shift;
    for (p = cw_lens + 1, q = shuff_lj_base; *p == 0; p++, q++)
        *q = SHUFF_MAX_ULONG;
}